

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test.hpp
# Opt level: O2

void nestl::test::CheckListSize<nestl::has_exceptions::list<int,nestl::allocator<int>>>
               (list<int,_nestl::allocator<int>_> *l,size_t expectedSize)

{
  size_type sVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  bool listIsEmpty;
  bool shouldBeEmpty;
  size_t dist;
  size_t cdist;
  bool local_2a;
  bool local_29;
  size_t local_28;
  size_type local_20;
  size_t local_18;
  
  local_28 = expectedSize;
  sVar1 = impl::list<int,_nestl::allocator<int>_>::size(&l->super_list<int,_nestl::allocator<int>_>)
  ;
  if (sVar1 != expectedSize) {
    local_20 = impl::list<int,_nestl::allocator<int>_>::size
                         (&l->super_list<int,_nestl::allocator<int>_>);
    fatal_failure<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((char (*) [16])"expected size: ",&local_28,(char (*) [8])", got: ",&local_20);
    expectedSize = local_28;
  }
  local_29 = expectedSize == 0;
  local_2a = (l->super_list<int,_nestl::allocator<int>_>).m_node.m_next ==
             &(l->super_list<int,_nestl::allocator<int>_>).m_node;
  if (local_29 != local_2a) {
    fatal_failure<char_const(&)[27],bool&,char_const(&)[22],bool&>
              ((char (*) [27])"list empty method returns ",&local_2a,
               (char (*) [22])", while it should be ",&local_29);
  }
  cVar2 = impl::list<int,_nestl::allocator<int>_>::begin
                    (&l->super_list<int,_nestl::allocator<int>_>);
  cVar3 = impl::list<int,_nestl::allocator<int>_>::end(&l->super_list<int,_nestl::allocator<int>_>);
  local_20 = std::__distance<nestl::impl::list_const_iterator<int>>(cVar2.m_node,cVar3.m_node);
  if (local_20 != local_28) {
    fatal_failure<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [38])"distance between iterators should be ",&local_28,
               (char (*) [16])" elements, got ",&local_20,(char (*) [10])" elements");
  }
  cVar2 = impl::list<int,_nestl::allocator<int>_>::cbegin
                    (&l->super_list<int,_nestl::allocator<int>_>);
  cVar3 = impl::list<int,_nestl::allocator<int>_>::cend(&l->super_list<int,_nestl::allocator<int>_>)
  ;
  local_18 = std::__distance<nestl::impl::list_const_iterator<int>>(cVar2.m_node,cVar3.m_node);
  if (local_18 != local_28) {
    fatal_failure<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [44])"distance between const iterators should be ",&local_28,
               (char (*) [16])" elements, got ",&local_18,(char (*) [10])" elements");
  }
  return;
}

Assistant:

void CheckListSize(const List& l, size_t expectedSize)
{
    if (l.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", l.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool listIsEmpty = l.empty();

    if (listIsEmpty != shouldBeEmpty)
    {
        fatal_failure("list empty method returns ", listIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(l.begin(), l.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(l.cbegin(), l.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be ", expectedSize, " elements, got ", cdist, " elements");
    }
}